

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O0

void __thiscall
GdlLanguageDefn::AddFeatureValue
          (GdlLanguageDefn *this,GdlFeatureDefn *pfeat,GdlFeatureSetting *pfset,int nFset,
          GrpLineAndFile *lnf)

{
  value_type *__x;
  value_type *ppGVar1;
  reference ppGVar2;
  reference pvVar3;
  int in_ECX;
  undefined8 in_RDX;
  value_type in_RSI;
  vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *in_RDI;
  string *in_R8;
  uint ifeat;
  allocator local_51;
  string local_50 [32];
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffe0;
  int nID;
  
  uVar4 = 0;
  while( true ) {
    __x = (value_type *)(ulong)uVar4;
    ppGVar1 = (value_type *)
              std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::size
                        ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)
                         &in_RDI[2].
                          super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
    if (ppGVar1 <= __x) {
      std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::push_back(in_RDI,__x);
      std::vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_>::push_back
                ((vector<GdlFeatureSetting_*,_std::allocator<GdlFeatureSetting_*>_> *)in_RDI,
                 (value_type *)__x);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_RDI,(value_type_conflict1 *)__x);
      return;
    }
    ppGVar2 = std::vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>::operator[]
                        ((vector<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_> *)
                         &in_RDI[2].
                          super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,(ulong)uVar4);
    nID = (int)((ulong)in_RDX >> 0x20);
    if (*ppGVar2 == in_RSI) break;
    uVar4 = uVar4 + 1;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)
                      &in_RDI[4].
                       super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(ulong)uVar4);
  if (*pvVar3 == in_ECX) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Duplicate language feature setting",&local_51);
  GrcErrorList::AddError
            ((GrcErrorList *)in_RSI,nID,(GdlObject *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             in_R8,(GrpLineAndFile *)CONCAT44(uVar4,in_stack_ffffffffffffffd0));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void GdlLanguageDefn::AddFeatureValue(GdlFeatureDefn * pfeat, GdlFeatureSetting * pfset,
	int nFset, GrpLineAndFile & lnf)
{
	for (auto ifeat = 0U; ifeat < m_vpfeat.size(); ++ifeat)
	{
		if (m_vpfeat[ifeat] == pfeat)
		{
			if (m_vnFset[ifeat] == nFset)
				return;
			else 
			{
				g_errorList.AddError(3160, NULL, "Duplicate language feature setting", lnf);
				return;
			}
		}
	}
	m_vpfeat.push_back(pfeat);
	m_vpfset.push_back(pfset);
	m_vnFset.push_back(nFset);
	Assert(m_vpfeat.size() == m_vpfset.size());
	Assert(m_vpfeat.size() == m_vnFset.size());
}